

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O0

MPP_RET mpp_meta_dump(MppMeta meta)

{
  long lVar1;
  char *key;
  RK_U32 i;
  MppMetaImpl *impl;
  MppMeta meta_local;
  
  if (meta == (MppMeta)0x0) {
    _mpp_log_l(2,"mpp_meta","found NULL input\n","mpp_meta_dump");
    meta_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    _mpp_log_l(4,"mpp_meta","dumping meta %d node count %d\n",(char *)0x0,
               (ulong)*(uint *)((long)meta + 0x28),(ulong)*(uint *)((long)meta + 0x40));
    for (key._4_4_ = 0; key._4_4_ < 0x2d; key._4_4_ = key._4_4_ + 1) {
      if (*(int *)((long)meta + (ulong)key._4_4_ * 0x10 + 0x48) != 0) {
        lVar1 = (ulong)key._4_4_ * 8;
        _mpp_log_l(4,"mpp_meta","key %c%c%c%c - %c\n",(char *)0x0,
                   (ulong)(uint)(int)(char)meta_defs[key._4_4_],
                   (ulong)(uint)(int)*(char *)((long)meta_defs + lVar1 + 1),
                   (int)*(char *)((long)meta_defs + lVar1 + 2),
                   (int)*(char *)((long)meta_defs + lVar1 + 3),meta_defs[key._4_4_] >> 0x20 & 0xff);
      }
    }
    meta_local._4_4_ = MPP_OK;
  }
  return meta_local._4_4_;
}

Assistant:

MPP_RET mpp_meta_dump(MppMeta meta)
{
    if (NULL == meta) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppMetaImpl *impl = (MppMetaImpl *)meta;
    RK_U32 i;

    mpp_log("dumping meta %d node count %d\n", impl->meta_id, impl->node_count);

    for (i = 0; i < MPP_ARRAY_ELEMS(meta_defs); i++) {
        if (!impl->vals[i].state)
            continue;

        const char *key = (const char *)&meta_defs[i];

        mpp_log("key %c%c%c%c - %c\n", key[0], key[1], key[2], key[3],
                (meta_defs[i] >> 32) & 0xff);
    }

    return MPP_OK;
}